

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall
fasttext::Dictionary::addSubwords
          (Dictionary *this,vector<int,_std::allocator<int>_> *line,string *token,int32_t wid)

{
  size_t __n;
  iterator __position;
  int iVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  long *plVar3;
  size_type *psVar4;
  int32_t local_64;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_64 = wid;
  if (-1 < wid) {
    if (0 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            maxn) {
      pvVar2 = getSubwords(this,wid);
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)line,
                 (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      return;
    }
    __position._M_current =
         (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current !=
        (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      *__position._M_current = wid;
      (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
      return;
    }
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)line,__position,&local_64);
    return;
  }
  __n = token->_M_string_length;
  if (__n == DAT_00140f80) {
    if (__n == 0) {
      return;
    }
    iVar1 = bcmp((token->_M_dataplus)._M_p,EOS_abi_cxx11_,__n);
    if (iVar1 == 0) {
      return;
    }
  }
  std::operator+(&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &BOW_abi_cxx11_,token);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_40,EOW_abi_cxx11_);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60.field_2._8_8_ = plVar3[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_60._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  computeSubwords(this,&local_60,line,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Dictionary::addSubwords(
    std::vector<int32_t>& line,
    const std::string& token,
    int32_t wid) const {
  if (wid < 0) { // out of vocab
    if (token != EOS) {
      computeSubwords(BOW + token + EOW, line);
    }
  } else {
    if (args_->maxn <= 0) { // in vocab w/o subwords
      line.push_back(wid);
    } else { // in vocab w/ subwords
      const std::vector<int32_t>& ngrams = getSubwords(wid);
      line.insert(line.end(), ngrams.cbegin(), ngrams.cend());
    }
  }
}